

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * flatbuffers::ConvertCase
                   (string *__return_storage_ptr__,string *input,Case output_case,Case input_case)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int iVar3;
  char cVar4;
  bool is_upper;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  pointer pcVar8;
  char cVar9;
  ulong uVar10;
  byte *pbVar11;
  string s;
  string local_90;
  function<char_(char)> local_70;
  function<char_(char)> local_50;
  
  if (output_case == kKeep) {
switchD_0014df28_caseD_3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = (input->_M_dataplus)._M_p;
    uVar7 = input->_M_string_length;
LAB_0014ded8:
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar8,pcVar8 + uVar7);
    return __return_storage_ptr__;
  }
  if (input_case - kUpperCamel < 2) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    if (input->_M_string_length != 0) {
      uVar7 = 0;
      do {
        pbVar11 = (byte *)(input->_M_dataplus)._M_p;
        if (uVar7 == 0) {
LAB_0014dfbd:
          uVar5 = (uint)*pbVar11;
LAB_0014dfc1:
          tolower(uVar5 & 0xff);
        }
        else {
          uVar5 = (uint)(char)pbVar11[uVar7];
          if ((uVar5 != 0x5f) && (iVar3 = islower(uVar5), iVar3 == 0)) {
            bVar2 = pbVar11[uVar7 - 1];
            iVar3 = islower((int)(char)bVar2);
            if ((iVar3 != 0) || ((0xfffffff5 < (int)(char)bVar2 - 0x3aU && (9 < uVar5 - 0x30)))) {
              std::__cxx11::string::push_back((char)&local_90);
              pbVar11 = (byte *)((input->_M_dataplus)._M_p + uVar7);
              goto LAB_0014dfbd;
            }
            goto LAB_0014dfc1;
          }
        }
        std::__cxx11::string::push_back((char)&local_90);
        uVar7 = uVar7 + 1;
      } while (uVar7 < input->_M_string_length);
    }
    ConvertCase(__return_storage_ptr__,&local_90,output_case,kSnake);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
LAB_0014e082:
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
    return __return_storage_ptr__;
  }
  if (input_case == kDasher) {
    paVar1 = &local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    if (input->_M_string_length != 0) {
      uVar7 = 0;
      do {
        if ((input->_M_dataplus)._M_p[uVar7] == '-') {
          std::__cxx11::string::append((char *)&local_90);
        }
        else {
          std::__cxx11::string::push_back((char)&local_90);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < input->_M_string_length);
    }
    ConvertCase(__return_storage_ptr__,&local_90,output_case,kSnake);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
    goto LAB_0014e082;
  }
  if (input_case == kKeep) {
    puts("WARNING: Converting from kKeep case.");
  }
  cVar9 = (char)__return_storage_ptr__;
  switch(output_case) {
  case kUpperCamel:
    is_upper = true;
    goto LAB_0014e1ab;
  case kLowerCamel:
    is_upper = false;
LAB_0014e1ab:
    anon_unknown_1::ToCamelCase(__return_storage_ptr__,input,is_upper);
    break;
  default:
    goto switchD_0014df28_caseD_3;
  case kScreamingSnake:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (input->_M_string_length != 0) {
      uVar7 = 0;
      do {
        pbVar11 = (byte *)(input->_M_dataplus)._M_p;
        if (uVar7 == 0) {
LAB_0014e22f:
          uVar5 = (uint)*pbVar11;
LAB_0014e232:
          toupper(uVar5 & 0xff);
        }
        else {
          uVar5 = (uint)(char)pbVar11[uVar7];
          if (uVar5 != 0x5f) {
            iVar3 = islower(uVar5);
            if (iVar3 == 0) {
              bVar2 = pbVar11[uVar7 - 1];
              iVar3 = islower((int)(char)bVar2);
              if ((iVar3 != 0) || ((0xfffffff5 < (int)(char)bVar2 - 0x3aU && (9 < uVar5 - 0x30)))) {
                std::__cxx11::string::push_back(cVar9);
                pbVar11 = (byte *)((input->_M_dataplus)._M_p + uVar7);
                goto LAB_0014e22f;
              }
            }
            goto LAB_0014e232;
          }
        }
        std::__cxx11::string::push_back(cVar9);
        uVar7 = uVar7 + 1;
      } while (uVar7 < input->_M_string_length);
    }
    break;
  case kAllUpper:
    local_50.super__Function_base._M_functor._8_8_ = 0;
    local_50.super__Function_base._M_functor._M_unused._M_object = CharToUpper;
    local_50._M_invoker = std::_Function_handler<char_(char),_char_(*)(char)>::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::_Function_handler<char_(char),_char_(*)(char)>::_M_manager;
    anon_unknown_1::ToAll(__return_storage_ptr__,input,&local_50);
    if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.super__Function_base._M_manager)
                ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
    break;
  case kAllLower:
    local_70.super__Function_base._M_functor._8_8_ = 0;
    local_70.super__Function_base._M_functor._M_unused._M_object = CharToLower;
    local_70._M_invoker = std::_Function_handler<char_(char),_char_(*)(char)>::_M_invoke;
    local_70.super__Function_base._M_manager =
         std::_Function_handler<char_(char),_char_(*)(char)>::_M_manager;
    anon_unknown_1::ToAll(__return_storage_ptr__,input,&local_70);
    if (local_70.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_70.super__Function_base._M_manager)
                ((_Any_data *)&local_70,(_Any_data *)&local_70,__destroy_functor);
    }
    break;
  case kDasher:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar7 = input->_M_string_length;
    if (uVar7 != 0) {
      cVar4 = '\0';
      uVar10 = 0;
      do {
        pcVar8 = (input->_M_dataplus)._M_p;
        if (pcVar8[uVar10] == '_') {
          if (((uVar10 != 0) && (cVar4 != '/')) &&
             ((uVar7 <= uVar10 + 1 || (9 < (int)pcVar8[uVar10 + 1] - 0x30U)))) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          std::__cxx11::string::push_back(cVar9);
        }
        cVar4 = pcVar8[uVar10];
        uVar10 = uVar10 + 1;
        uVar7 = input->_M_string_length;
      } while (uVar10 < uVar7);
    }
    break;
  case kSnake2:
    uVar7 = input->_M_string_length;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (1 < uVar7) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      if (input->_M_string_length != 1) {
        uVar7 = 0;
        do {
          pcVar8 = (input->_M_dataplus)._M_p;
          if ((pcVar8[uVar7] != '_') || (9 < (int)pcVar8[uVar7 + 1] - 0x30U)) {
            std::__cxx11::string::push_back(cVar9);
            pcVar8 = (input->_M_dataplus)._M_p;
            if ((int)pcVar8[uVar7] - 0x30U < 10) {
              iVar6 = (int)pcVar8[uVar7 + 1];
              iVar3 = isalpha(iVar6);
              if ((iVar3 != 0) && (iVar3 = islower(iVar6), iVar3 != 0)) {
                std::__cxx11::string::push_back(cVar9);
              }
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < input->_M_string_length - 1);
      }
      std::__cxx11::string::push_back(cVar9);
      return __return_storage_ptr__;
    }
    pcVar8 = (input->_M_dataplus)._M_p;
    goto LAB_0014ded8;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertCase(const std::string &input, Case output_case,
                        Case input_case) {
  if (output_case == Case::kKeep) return input;
  // The output cases expect snake_case inputs, so if we don't have that input
  // format, try to convert to snake_case.
  switch (input_case) {
    case Case::kLowerCamel:
    case Case::kUpperCamel:
      return ConvertCase(CamelToSnake(input), output_case);
    case Case::kDasher: return ConvertCase(DasherToSnake(input), output_case);
    case Case::kKeep: printf("WARNING: Converting from kKeep case.\n"); break;
    default:
    case Case::kSnake:
    case Case::kScreamingSnake:
    case Case::kAllLower:
    case Case::kAllUpper: break;
  }

  switch (output_case) {
    case Case::kUpperCamel: return ToCamelCase(input, true);
    case Case::kLowerCamel: return ToCamelCase(input, false);
    case Case::kSnake: return input;
    case Case::kScreamingSnake: return ToSnakeCase(input, true);
    case Case::kAllUpper: return ToAll(input, CharToUpper);
    case Case::kAllLower: return ToAll(input, CharToLower);
    case Case::kDasher: return ToDasher(input);
    case Case::kSnake2: return SnakeToSnake2(input);
    default:
    case Case::kUnknown: return input;
  }
}